

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtlsbackend_openssl.cpp
# Opt level: O0

void q_loadCiphersForConnection
               (SSL *connection,QList<QSslCipher> *ciphers,QList<QSslCipher> *defaultCiphers)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  void *pvVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  QLatin1StringView QVar9;
  SSL_CIPHER *cipher;
  int i;
  stack_st_SSL_CIPHER *supportedCiphers;
  QSslCipher ciph;
  undefined2 in_stack_fffffffffffffee8;
  byte in_stack_fffffffffffffeea;
  byte in_stack_fffffffffffffeeb;
  byte bVar10;
  undefined4 in_stack_fffffffffffffeec;
  int iVar11;
  QLatin1StringView in_stack_fffffffffffffef0;
  QLatin1StringView in_stack_ffffffffffffff20;
  int local_c4;
  undefined1 local_88 [48];
  undefined1 local_58 [48];
  undefined1 local_28 [24];
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_SSL_get_ciphers((SSL *)CONCAT44(in_stack_fffffffffffffeec,
                                    CONCAT13(in_stack_fffffffffffffeeb,
                                             CONCAT12(in_stack_fffffffffffffeea,
                                                      in_stack_fffffffffffffee8))));
  local_c4 = 0;
  while (iVar11 = local_c4,
        iVar5 = q_OPENSSL_sk_num((OPENSSL_STACK *)
                                 CONCAT44(local_c4,CONCAT13(in_stack_fffffffffffffeeb,
                                                            CONCAT12(in_stack_fffffffffffffeea,
                                                                     in_stack_fffffffffffffee8)))),
        iVar11 < iVar5) {
    pvVar7 = q_OPENSSL_sk_value((OPENSSL_STACK *)
                                CONCAT44(iVar11,CONCAT13(in_stack_fffffffffffffeeb,
                                                         CONCAT12(in_stack_fffffffffffffeea,
                                                                  in_stack_fffffffffffffee8))),0);
    if (pvVar7 != (void *)0x0) {
      local_10 = 0xaaaaaaaaaaaaaaaa;
      QTlsBackendOpenSSL::qt_OpenSSL_cipher_to_QSslCipher
                ((SSL_CIPHER *)in_stack_ffffffffffffff20.m_size);
      uVar8 = QSslCipher::isNull();
      if ((uVar8 & 1) == 0) {
        QSslCipher::name();
        QString::toLower((QString *)
                         CONCAT44(iVar11,CONCAT13(in_stack_fffffffffffffeeb,
                                                  CONCAT12(in_stack_fffffffffffffeea,
                                                           in_stack_fffffffffffffee8))));
        in_stack_ffffffffffffff20 =
             Qt::Literals::StringLiterals::operator____L1
                       (in_stack_fffffffffffffef0.m_data,in_stack_fffffffffffffef0.m_size);
        uVar6 = QString::startsWith((QLatin1String *)local_28,
                                    (CaseSensitivity)in_stack_ffffffffffffff20.m_size);
        bVar4 = false;
        bVar3 = false;
        bVar2 = false;
        bVar1 = false;
        bVar10 = 0;
        if ((uVar6 & 1) == 0) {
          QSslCipher::name();
          bVar4 = true;
          QString::toLower((QString *)
                           CONCAT44(iVar11,CONCAT13(bVar10,CONCAT12(in_stack_fffffffffffffeea,
                                                                    in_stack_fffffffffffffee8))));
          bVar3 = true;
          QVar9 = Qt::Literals::StringLiterals::operator____L1
                            (in_stack_fffffffffffffef0.m_data,in_stack_fffffffffffffef0.m_size);
          uVar6 = QString::startsWith((QLatin1String *)local_58,(CaseSensitivity)QVar9.m_size);
          bVar10 = 0;
          if ((uVar6 & 1) == 0) {
            QSslCipher::name();
            bVar2 = true;
            QString::toLower((QString *)
                             CONCAT44(iVar11,CONCAT13(bVar10,CONCAT12(in_stack_fffffffffffffeea,
                                                                      in_stack_fffffffffffffee8))));
            bVar1 = true;
            in_stack_fffffffffffffef0 =
                 Qt::Literals::StringLiterals::operator____L1
                           (in_stack_fffffffffffffef0.m_data,in_stack_fffffffffffffef0.m_size);
            bVar10 = QString::startsWith((QLatin1String *)local_88,
                                         (CaseSensitivity)in_stack_fffffffffffffef0.m_size);
            bVar10 = bVar10 ^ 0xff;
          }
        }
        in_stack_fffffffffffffeea = bVar10;
        in_stack_fffffffffffffeeb = in_stack_fffffffffffffeea;
        if (bVar1) {
          QString::~QString((QString *)0x126b8a);
        }
        if (bVar2) {
          QString::~QString((QString *)0x126b9d);
        }
        if (bVar3) {
          QString::~QString((QString *)0x126bb3);
        }
        if (bVar4) {
          QString::~QString((QString *)0x126bc9);
        }
        QString::~QString((QString *)0x126bd6);
        QString::~QString((QString *)0x126be3);
        if ((in_stack_fffffffffffffeea & 1) != 0) {
          QList<QSslCipher>::operator<<
                    ((QList<QSslCipher> *)in_stack_fffffffffffffef0.m_size,
                     (parameter_type)
                     CONCAT44(iVar11,CONCAT13(in_stack_fffffffffffffeeb,
                                              CONCAT12(in_stack_fffffffffffffeea,
                                                       in_stack_fffffffffffffee8))));
          iVar5 = QSslCipher::usedBits();
          if (0x7f < iVar5) {
            QList<QSslCipher>::operator<<
                      ((QList<QSslCipher> *)in_stack_fffffffffffffef0.m_size,
                       (parameter_type)
                       CONCAT44(iVar11,CONCAT13(in_stack_fffffffffffffeeb,
                                                CONCAT12(in_stack_fffffffffffffeea,
                                                         in_stack_fffffffffffffee8))));
          }
        }
      }
      QSslCipher::~QSslCipher((QSslCipher *)&local_10);
    }
    local_c4 = local_c4 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void q_loadCiphersForConnection(SSL *connection, QList<QSslCipher> &ciphers,
                                       QList<QSslCipher> &defaultCiphers)
{
    Q_ASSERT(connection);

    STACK_OF(SSL_CIPHER) *supportedCiphers = q_SSL_get_ciphers(connection);
    for (int i = 0; i < q_sk_SSL_CIPHER_num(supportedCiphers); ++i) {
        if (SSL_CIPHER *cipher = q_sk_SSL_CIPHER_value(supportedCiphers, i)) {
            const auto ciph = QTlsBackendOpenSSL::qt_OpenSSL_cipher_to_QSslCipher(cipher);
            if (!ciph.isNull()) {
                // Unconditionally exclude ADH and AECDH ciphers since they offer no MITM protection
                if (!ciph.name().toLower().startsWith("adh"_L1) &&
                    !ciph.name().toLower().startsWith("exp-adh"_L1) &&
                    !ciph.name().toLower().startsWith("aecdh"_L1)) {
                    ciphers << ciph;

                    if (ciph.usedBits() >= 128)
                        defaultCiphers << ciph;
                }
            }
        }
    }
}